

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EefcFlash.cpp
# Opt level: O2

vector<bool,_std::allocator<bool>_> * __thiscall
EefcFlash::getLockRegions
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,EefcFlash *this)

{
  uint32_t uVar1;
  ulong *puVar2;
  uint uVar3;
  ulong uVar4;
  ulong __n;
  reference rVar5;
  allocator_type local_39;
  vector<bool,_std::allocator<bool>_> *local_38;
  
  local_38 = __return_storage_ptr__;
  std::vector<bool,_std::allocator<bool>_>::vector
            (__return_storage_ptr__,(ulong)(this->super_Flash)._lockRegions,&local_39);
  waitFSR(this,1);
  for (__n = 0; uVar3 = (this->super_Flash)._lockRegions, __n < uVar3; __n = __n + 1) {
    if (((this->super_Flash)._planes == 2) && (uVar3 = uVar3 >> 1, uVar3 <= __n)) {
      writeFCR1(this,'\n',0);
      waitFSR(this,1);
      uVar1 = readFRR1(this);
      for (uVar3 = (int)__n - uVar3; 0x1f < uVar3; uVar3 = uVar3 - 0x20) {
        uVar1 = readFRR1(this);
      }
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](local_38,__n);
      puVar2 = rVar5._M_p;
      if ((uVar1 >> (uVar3 & 0x1f) & 1) == 0) {
        *puVar2 = *puVar2 & ~rVar5._M_mask;
      }
      else {
        *puVar2 = *puVar2 | rVar5._M_mask;
      }
    }
    else {
      writeFCR0(this,'\n',0);
      waitFSR(this,1);
      uVar1 = readFRR0(this);
      uVar4 = __n & 0xffffffff;
      while (uVar3 = (uint)uVar4, 0x1f < uVar3) {
        uVar1 = readFRR0(this);
        uVar4 = (ulong)(uVar3 - 0x20);
      }
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](local_38,__n);
      puVar2 = rVar5._M_p;
      if ((uVar1 >> (uVar3 & 0x1f) & 1) == 0) {
        *puVar2 = *puVar2 & ~rVar5._M_mask;
      }
      else {
        *puVar2 = *puVar2 | rVar5._M_mask;
      }
    }
  }
  return local_38;
}

Assistant:

std::vector<bool>
EefcFlash::getLockRegions()
{
    std::vector<bool> regions(_lockRegions);
    uint32_t frr;
    uint32_t bit;

    waitFSR();
    for (uint32_t region = 0; region < _lockRegions; region++)
    {
        if (_planes == 2 && region >= _lockRegions / 2)
        {
            bit = region - _lockRegions / 2;
            writeFCR1(EEFC_FCMD_GLB, 0);
            waitFSR();
            frr = readFRR1();
            while (bit >= 32)
            {
                frr = readFRR1();
                bit -= 32;
            }
            regions[region] = (frr & (1 << bit)) != 0;
        }
        else
        {
            bit = region;
            writeFCR0(EEFC_FCMD_GLB, 0);
            waitFSR();
            frr = readFRR0();
            while (bit >= 32)
            {
                frr = readFRR0();
                bit -= 32;
            }
            regions[region] = (frr & (1 << bit)) != 0;
        }
    }

    return regions;
}